

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int AF_AActor_Vec3To(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  AActor *this;
  bool bVar1;
  bool local_71;
  DObject *local_70;
  bool local_63;
  undefined1 local_60 [8];
  DVector3 u;
  AActor *t;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e4f,"int AF_AActor_Vec3To(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e4f,"int AF_AActor_Vec3To(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  local_63 = true;
  if (this != (AActor *)0x0) {
    local_63 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_63 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e4f,"int AF_AActor_Vec3To(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e50,"int AF_AActor_Vec3To(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar1 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar1 = true, param[1].field_0.field_1.atag != 1)) {
    bVar1 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar1) {
    if (param[1].field_0.field_1.a == (void *)0x0) {
      NullParam("\"t\"");
      local_70 = (DObject *)param[1].field_0.f;
    }
    else {
      local_70 = (DObject *)param[1].field_0.f;
    }
    u.Z = (double)local_70;
    local_71 = true;
    if (local_70 != (DObject *)0x0) {
      local_71 = DObject::IsKindOf(local_70,AActor::RegistrationInfo.MyClass);
    }
    if (local_71 != false) {
      AActor::Vec3To((DVector3 *)local_60,this,(AActor *)u.Z);
      if (numret < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1e51,
                        "int AF_AActor_Vec3To(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        VMReturn::SetVector(ret,(DVector3 *)local_60);
        param_local._4_4_ = 1;
      }
      return param_local._4_4_;
    }
    __assert_fail("t == NULL || t->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e50,"int AF_AActor_Vec3To(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1e50,"int AF_AActor_Vec3To(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Vec3To)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(t, AActor)
	ACTION_RETURN_VEC3(self->Vec3To(t));
}